

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O2

bool flatbuffers::anon_unknown_94::VerifyUnion
               (Verifier *v,Schema *schema,uint8_t utype,uint8_t *elem,Field *union_field)

{
  bool bVar1;
  BaseType BVar2;
  int32_t iVar3;
  Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int> *this;
  Type *pTVar4;
  char *pcVar5;
  return_type this_00;
  Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int> *pVVar6;
  return_type this_01;
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *this_02;
  return_type this_03;
  int __c;
  int __c_00;
  undefined7 in_register_00000011;
  Schema *__s;
  
  if ((int)CONCAT71(in_register_00000011,utype) == 0) {
    bVar1 = true;
  }
  else {
    __s = schema;
    this = reflection::Schema::enums(schema);
    pTVar4 = reflection::Field::type(union_field);
    pcVar5 = reflection::Type::index(pTVar4,(char *)__s,__c);
    this_00 = Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int>::Get(this,(uint)pcVar5);
    pcVar5 = (char *)(ulong)utype;
    pVVar6 = reflection::Enum::values(this_00);
    if ((uint)utype < *(uint *)pVVar6) {
      pVVar6 = reflection::Enum::values(this_00);
      this_01 = Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int>::Get
                          (pVVar6,(uint)utype);
      pTVar4 = reflection::EnumVal::union_type(this_01);
      BVar2 = reflection::Type::base_type(pTVar4);
      if (BVar2 == String) {
        bVar1 = VerifierTemplate<false>::VerifyString(v,(String *)elem);
        return bVar1;
      }
      if (BVar2 == Obj) {
        this_02 = reflection::Schema::objects(schema);
        pcVar5 = reflection::Type::index(pTVar4,pcVar5,__c_00);
        this_03 = Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::Get
                            (this_02,(uint)pcVar5);
        bVar1 = reflection::Object::is_struct(this_03);
        if (bVar1) {
          iVar3 = reflection::Object::bytesize(this_03);
          return (ulong)((long)elem - (long)v->buf_) <= v->size_ - (long)iVar3 &&
                 (ulong)(long)iVar3 < v->size_;
        }
        bVar1 = VerifyObject(v,schema,this_03,(Table *)elem,true);
        return bVar1;
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool VerifyUnion(flatbuffers::Verifier &v,
                        const reflection::Schema &schema, uint8_t utype,
                        const uint8_t *elem,
                        const reflection::Field &union_field) {
  if (!utype) return true;  // Not present.
  auto fb_enum = schema.enums()->Get(union_field.type()->index());
  if (utype >= fb_enum->values()->size()) return false;
  auto elem_type = fb_enum->values()->Get(utype)->union_type();
  switch (elem_type->base_type()) {
    case reflection::Obj: {
      auto elem_obj = schema.objects()->Get(elem_type->index());
      if (elem_obj->is_struct()) {
        return v.VerifyFromPointer(elem, elem_obj->bytesize());
      } else {
        return VerifyObject(v, schema, *elem_obj,
                            reinterpret_cast<const flatbuffers::Table *>(elem),
                            true);
      }
    }
    case reflection::String:
      return v.VerifyString(
          reinterpret_cast<const flatbuffers::String *>(elem));
    default: return false;
  }
}